

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O1

void __thiscall MultiANN::AddPoint(MultiANN *this,ANNpoint x_coor,void *x_ptr)

{
  int iVar1;
  ANNpoint pAVar2;
  uint uVar3;
  long lVar4;
  
  iVar1 = this->dimension;
  if (0 < (long)iVar1) {
    pAVar2 = this->points_coor[this->size];
    lVar4 = 0;
    do {
      pAVar2[lVar4] = x_coor[lVar4];
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  iVar1 = this->size;
  this->points_ptr[iVar1] = x_ptr;
  uVar3 = iVar1 + 1;
  this->size = uVar3;
  if (((uVar3 & 0xf) == 0) && (uVar3 != this->LastNodeCount)) {
    this->LastNodeCount = uVar3;
    UpdateAnnArray(this);
    return;
  }
  return;
}

Assistant:

void MultiANN::AddPoint(  // dynamic update of the data points
    ANNpoint x_coor,      // coordinates of the point
    void *x_ptr)          // pointer to the point
{
    for (int i = 0; i < dimension; i++) {
        points_coor[size][i] = x_coor[i];
    }
    points_ptr[size] = (void *)x_ptr;
    size++;

    if ((size != LastNodeCount) &&
        (size % ((int)pow((double)2, ANN_STARTING_INDEX)) ==
         0)) {  // Check if it is time to update the ANNs
        LastNodeCount = size;
        UpdateAnnArray();
    }
}